

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# citylots_std.cpp
# Opt level: O0

bool __thiscall JSONValue::has_item(JSONValue *this,string *key)

{
  bool bVar1;
  size_type sVar2;
  string *key_local;
  JSONValue *this_local;
  
  bVar1 = is_object(this);
  if (!bVar1) {
    __assert_fail("is_object()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/benchmarks/cpp/citylots_std.cpp"
                  ,0x8e,"bool JSONValue::has_item(const std::string &) const");
  }
  sVar2 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSONValue,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSONValue>_>_>
          ::count((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSONValue,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSONValue>_>_>
                   *)(this->field_1).svalue,key);
  return sVar2 != 0;
}

Assistant:

bool has_item(const std::string& key) const
    {
        assert(is_object());
        return ovalue->count(key) > 0;
    }